

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O3

void out_AddSection(Section *section)

{
  SectionType SVar1;
  uint uVar2;
  SortedSections *pSVar3;
  SortedSection *pSVar4;
  SortedSections *pSVar5;
  SortedSection *pSVar6;
  SortedSection *pSVar7;
  uint uVar8;
  uint uVar9;
  
  SVar1 = section->type;
  uVar9 = section->bank;
  uVar8 = (uVar9 - sectionTypeInfo[SVar1].firstBank) + 1;
  if (out_AddSection::maxNbBanks[SVar1] < uVar8) {
    errx("Section \"%s\" has an invalid bank range (%u > %u)",section->name,(ulong)uVar9,
         (ulong)(out_AddSection::maxNbBanks[SVar1] - 1));
  }
  uVar9 = uVar9 - sectionTypeInfo[SVar1].firstBank;
  if (sections[SVar1].nbBanks < uVar8) {
    pSVar3 = (SortedSections *)realloc(sections[SVar1].banks,(ulong)uVar8 << 4);
    SVar1 = section->type;
    sections[SVar1].banks = pSVar3;
    uVar2 = sections[SVar1].nbBanks;
    if (uVar2 < uVar8) {
      memset(pSVar3 + uVar2,0,(ulong)(uVar9 - uVar2) * 0x10 + 0x10);
    }
    sections[SVar1].nbBanks = uVar8;
  }
  else {
    pSVar3 = sections[SVar1].banks;
  }
  if (pSVar3 == (SortedSections *)0x0) {
    err("Failed to realloc banks");
  }
  pSVar4 = (SortedSection *)malloc(0x10);
  if (pSVar4 == (SortedSection *)0x0) {
    err("Failed to add new section \"%s\"",section->name);
  }
  pSVar5 = (SortedSections *)&pSVar3->zeroLenSections;
  if (section->size != 0) {
    pSVar5 = pSVar3;
  }
  pSVar5 = pSVar5 + uVar9;
  pSVar4->section = section;
  pSVar7 = pSVar5->sections;
  if (pSVar7 == (SortedSection *)0x0) {
    pSVar7 = (SortedSection *)0x0;
  }
  else if (pSVar7->section->org < section->org) {
    do {
      pSVar6 = pSVar7;
      pSVar7 = pSVar6->next;
      if (pSVar7 == (SortedSection *)0x0) {
        pSVar7 = (SortedSection *)0x0;
        break;
      }
    } while (pSVar7->section->org < section->org);
    pSVar5 = (SortedSections *)&pSVar6->next;
  }
  pSVar4->next = pSVar7;
  pSVar5->sections = pSVar4;
  return;
}

Assistant:

void out_AddSection(struct Section const *section)
{
	static uint32_t maxNbBanks[] = {
		AT(SECTTYPE_WRAM0) 1,
		AT(SECTTYPE_VRAM)  2,
		AT(SECTTYPE_ROMX)  UINT32_MAX,
		AT(SECTTYPE_ROM0)  1,
		AT(SECTTYPE_HRAM)  1,
		AT(SECTTYPE_WRAMX) 7,
		AT(SECTTYPE_SRAM)  UINT32_MAX,
		AT(SECTTYPE_OAM)   1,
	};

	uint32_t targetBank = section->bank - sectionTypeInfo[section->type].firstBank;
	uint32_t minNbBanks = targetBank + 1;

	if (minNbBanks > maxNbBanks[section->type])
		errx("Section \"%s\" has an invalid bank range (%" PRIu32 " > %" PRIu32 ")",
		     section->name, section->bank,
		     maxNbBanks[section->type] - 1);

	if (minNbBanks > sections[section->type].nbBanks) {
		sections[section->type].banks =
			(struct SortedSections *)realloc(sections[section->type].banks,
				sizeof(*sections[0].banks) * minNbBanks);
		for (uint32_t i = sections[section->type].nbBanks; i < minNbBanks; i++) {
			sections[section->type].banks[i].sections = NULL;
			sections[section->type].banks[i].zeroLenSections = NULL;
		}
		sections[section->type].nbBanks = minNbBanks;
	}
	if (!sections[section->type].banks)
		err("Failed to realloc banks");

	struct SortedSection *newSection = (struct SortedSection *)malloc(sizeof(*newSection));
	struct SortedSection **ptr = section->size
		? &sections[section->type].banks[targetBank].sections
		: &sections[section->type].banks[targetBank].zeroLenSections;

	if (!newSection)
		err("Failed to add new section \"%s\"", section->name);
	newSection->section = section;

	while (*ptr && (*ptr)->section->org < section->org)
		ptr = &(*ptr)->next;

	newSection->next = *ptr;
	*ptr = newSection;
}